

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::testRunStarting(SonarQubeReporter *this,TestRunInfo *testRunInfo)

{
  StringRef text;
  TestRunInfo *in_RSI;
  CumulativeReporterBase *in_RDI;
  string *in_stack_ffffffffffffff38;
  StringRef *in_stack_ffffffffffffff40;
  XmlFormatting fmt;
  undefined8 in_stack_ffffffffffffff48;
  XmlFormatting fmt_00;
  CumulativeReporterBase *name;
  XmlWriter *in_stack_ffffffffffffff50;
  XmlWriter *this_00;
  undefined1 *puVar1;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 in_stack_ffffffffffffff78 [16];
  allocator<char> local_71;
  string local_70 [8];
  IConfig *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  StringRef in_stack_ffffffffffffffc8;
  
  fmt_00 = (XmlFormatting)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  CumulativeReporterBase::testRunStarting(in_RDI,in_RSI);
  puVar1 = &stack0xffffffffffffffc0;
  (anonymous_namespace)::createMetadataString_abi_cxx11_(in_stack_ffffffffffffff98);
  StringRef::StringRef(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  fmt = (XmlFormatting)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  operator|(Newline,Indent);
  text.m_size = (size_type)puVar1;
  text.m_start = (char *)in_RDI;
  XmlWriter::writeComment(in_stack_ffffffffffffff50,text,fmt_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  name = in_RDI + 1;
  this_00 = (XmlWriter *)&local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff78._8_8_,in_stack_ffffffffffffff78._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  operator|(Newline,Indent);
  XmlWriter::startElement(this_00,(string *)name,fmt);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  operator____sr((char *)(in_RDI + 1),(size_t)in_stack_ffffffffffffff38);
  XmlWriter::writeAttribute<char,void>
            ((XmlWriter *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void SonarQubeReporter::testRunStarting(TestRunInfo const& testRunInfo) {
        CumulativeReporterBase::testRunStarting(testRunInfo);

        xml.writeComment( createMetadataString( *m_config ) );
        xml.startElement("testExecutions");
        xml.writeAttribute("version"_sr, '1');
    }